

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ForeachLoopListSyntax::ForeachLoopListSyntax
          (ForeachLoopListSyntax *this,Token openParen,NameSyntax *arrayName,Token openBracket,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *loopVariables,Token closeBracket,
          Token closeParen)

{
  bool bVar1;
  NameSyntax *pNVar2;
  NameSyntax *in_RCX;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_ffffffffffffff78;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *this_00;
  NameSyntax *local_38;
  NameSyntax *local_30;
  undefined8 local_20;
  SyntaxNode *local_18;
  undefined8 local_10;
  SyntaxNode *local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&stack0x00000010;
  local_30 = in_RCX;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDX;
  SyntaxNode::SyntaxNode(in_RDI,ForeachLoopList);
  *(undefined8 *)(in_RDI + 1) = local_10;
  in_RDI[1].parent = local_8;
  local_38 = local_30;
  not_null<slang::syntax::NameSyntax_*>::not_null<slang::syntax::NameSyntax_*>
            ((not_null<slang::syntax::NameSyntax_*> *)&in_RDI[1].previewNode,&local_38);
  *(undefined8 *)(in_RDI + 2) = local_20;
  in_RDI[2].parent = local_18;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff78);
  *(_func_int ***)(in_RDI + 5) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[5].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[5].previewNode = (SyntaxNode *)child;
  *(ParentList **)(in_RDI + 6) = __end2.list;
  pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator->
                     ((not_null<slang::syntax::NameSyntax_*> *)0x792857);
  (pNVar2->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
  in_RDI[3].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x79287a);
  SeparatedSyntaxList<slang::syntax::NameSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::NameSyntax_*> *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pNVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                          *)0x7928b9);
    (pNVar2->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

ForeachLoopListSyntax(Token openParen, NameSyntax& arrayName, Token openBracket, const SeparatedSyntaxList<NameSyntax>& loopVariables, Token closeBracket, Token closeParen) :
        SyntaxNode(SyntaxKind::ForeachLoopList), openParen(openParen), arrayName(&arrayName), openBracket(openBracket), loopVariables(loopVariables), closeBracket(closeBracket), closeParen(closeParen) {
        this->arrayName->parent = this;
        this->loopVariables.parent = this;
        for (auto child : this->loopVariables)
            child->parent = this;
    }